

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_frame.c
# Opt level: O3

int frame_pack_headers_shared(nghttp2_bufs *bufs,nghttp2_frame_hd *frame_hd)

{
  uint8_t uVar1;
  uint32_t n;
  uint8_t *puVar2;
  nghttp2_buf_chain *pnVar3;
  int extraout_EAX;
  byte bVar4;
  nghttp2_buf_chain *pnVar5;
  
  pnVar5 = bufs->head;
  puVar2 = (pnVar5->buf).pos;
  bVar4 = frame_hd->flags & 0xfb;
  if (pnVar5 == bufs->cur) {
    bVar4 = frame_hd->flags;
  }
  n = frame_hd->stream_id;
  uVar1 = frame_hd->type;
  (pnVar5->buf).pos = puVar2 + -9;
  nghttp2_put_uint32be(puVar2 + -9,(*(int *)&(pnVar5->buf).last - (int)puVar2) * 0x100);
  puVar2[-6] = uVar1;
  puVar2[-5] = bVar4;
  nghttp2_put_uint32be(puVar2 + -4,n);
  pnVar5 = bufs->head;
  pnVar3 = bufs->cur;
  if (pnVar5 != pnVar3) {
    for (pnVar5 = pnVar5->next; pnVar5 != pnVar3; pnVar5 = pnVar5->next) {
      puVar2 = (pnVar5->buf).pos;
      (pnVar5->buf).pos = puVar2 + -9;
      nghttp2_put_uint32be(puVar2 + -9,(*(int *)&(pnVar5->buf).last - (int)puVar2) * 0x100);
      puVar2[-6] = '\t';
      puVar2[-5] = '\0';
      nghttp2_put_uint32be(puVar2 + -4,n);
    }
    puVar2 = (pnVar5->buf).pos;
    (pnVar5->buf).pos = puVar2 + -9;
    nghttp2_put_uint32be(puVar2 + -9,(*(int *)&(pnVar5->buf).last - (int)puVar2) * 0x100);
    puVar2[-6] = '\t';
    puVar2[-5] = '\x04';
    nghttp2_put_uint32be(puVar2 + -4,n);
    return extraout_EAX;
  }
  return (int)pnVar5;
}

Assistant:

static int frame_pack_headers_shared(nghttp2_bufs *bufs,
                                     nghttp2_frame_hd *frame_hd) {
  nghttp2_buf *buf;
  nghttp2_buf_chain *ci, *ce;
  nghttp2_frame_hd hd;

  buf = &bufs->head->buf;

  hd = *frame_hd;
  hd.length = nghttp2_buf_len(buf);

  DEBUGF("send: HEADERS/PUSH_PROMISE, payloadlen=%zu\n", hd.length);

  /* We have multiple frame buffers, which means one or more
     CONTINUATION frame is involved. Remove END_HEADERS flag from the
     first frame. */
  if (bufs->head != bufs->cur) {
    hd.flags = (uint8_t)(hd.flags & ~NGHTTP2_FLAG_END_HEADERS);
  }

  buf->pos -= NGHTTP2_FRAME_HDLEN;
  nghttp2_frame_pack_frame_hd(buf->pos, &hd);

  if (bufs->head != bufs->cur) {
    /* 2nd and later frames are CONTINUATION frames. */
    hd.type = NGHTTP2_CONTINUATION;
    /* We don't have no flags except for last CONTINUATION */
    hd.flags = NGHTTP2_FLAG_NONE;

    ce = bufs->cur;

    for (ci = bufs->head->next; ci != ce; ci = ci->next) {
      buf = &ci->buf;

      hd.length = nghttp2_buf_len(buf);

      DEBUGF("send: int CONTINUATION, payloadlen=%zu\n", hd.length);

      buf->pos -= NGHTTP2_FRAME_HDLEN;
      nghttp2_frame_pack_frame_hd(buf->pos, &hd);
    }

    buf = &ci->buf;
    hd.length = nghttp2_buf_len(buf);
    /* Set END_HEADERS flag for last CONTINUATION */
    hd.flags = NGHTTP2_FLAG_END_HEADERS;

    DEBUGF("send: last CONTINUATION, payloadlen=%zu\n", hd.length);

    buf->pos -= NGHTTP2_FRAME_HDLEN;
    nghttp2_frame_pack_frame_hd(buf->pos, &hd);
  }

  return 0;
}